

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint count(uint *v,uint len,uint item)

{
  uint local_20;
  uint local_1c;
  uint i;
  uint c;
  uint item_local;
  uint len_local;
  uint *v_local;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    if (v[local_20] == item) {
      local_1c = local_1c + 1;
    }
  }
  return local_1c;
}

Assistant:

uint32_t count(uint32_t *v, uint32_t len, uint32_t item)
{
    uint32_t c = 0;
    for (uint32_t i = 0; i < len; i++)
        if (v[i] == item)
            c++;
    return c;
}